

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O2

void * nettlp_cb_thread(void *arg)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  nettlp *nt;
  cpu_set_t target_cpu_set;
  
  bVar2 = *(byte *)((long)arg + 0x12);
  iVar4 = count_online_cpus();
  uVar3 = (long)(ulong)bVar2 % (long)iVar4;
  uVar5 = uVar3 & 0xffffffff;
  target_cpu_set.__bits[0] = 0;
  target_cpu_set.__bits[1] = 0;
  target_cpu_set.__bits[2] = 0;
  target_cpu_set.__bits[3] = 0;
  target_cpu_set.__bits[4] = 0;
  target_cpu_set.__bits[5] = 0;
  target_cpu_set.__bits[6] = 0;
  target_cpu_set.__bits[7] = 0;
  target_cpu_set.__bits[8] = 0;
  target_cpu_set.__bits[9] = 0;
  target_cpu_set.__bits[10] = 0;
  target_cpu_set.__bits[0xb] = 0;
  target_cpu_set.__bits[0xc] = 0;
  target_cpu_set.__bits[0xd] = 0;
  target_cpu_set.__bits[0xe] = 0;
  target_cpu_set.__bits[0xf] = 0;
  puVar1 = (ulong *)((long)target_cpu_set.__bits + (ulong)((uint)(uVar3 >> 3) & 0x18));
  *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
  nt = (nettlp *)((long)arg + 8);
  pthread_setaffinity_np(*arg,0x80,(cpu_set_t *)&target_cpu_set);
  if (nostdout == '\0') {
    fprintf(_stdout,"%s: start callback on cpu %d, port %u\n","nettlp_cb_thread",uVar5,
            (ulong)*(ushort *)((long)arg + 0x1c));
  }
  nettlp_run_cb(&nt,1,*(nettlp_cb **)((long)arg + 0x28),*(void **)((long)arg + 0x20));
  return (void *)0x0;
}

Assistant:

void *nettlp_cb_thread(void *arg)
{
	struct psmem_thread *pt = arg;
	int cpu = pt->nt.tag % count_online_cpus();
	cpu_set_t target_cpu_set;
	struct nettlp *nt = &pt->nt;
	
	CPU_ZERO(&target_cpu_set);
	CPU_SET(cpu, &target_cpu_set);
	pthread_setaffinity_np(pt->tid, sizeof(cpu_set_t), &target_cpu_set);

	pr_info("start callback on cpu %d, port %u\n", cpu, pt->nt.port);
	nettlp_run_cb(&(nt), 1, pt->cb, pt->psmem);

	return NULL;
}